

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

void gen_align_bits(DisasContext_conflict6 *ctx,int wordsz,int rd,int rs,int rt,int bits)

{
  TCGContext_conflict6 *tcg_ctx;
  TCGv_i64 t;
  TCGv_i64 t_00;
  TCGv_i64 ret;
  uintptr_t o;
  
  if (rd != 0) {
    tcg_ctx = ctx->uc->tcg_ctx;
    t = tcg_temp_new_i64(tcg_ctx);
    if (bits == 0 || bits == wordsz) {
      if (bits == 0) {
        rs = rt;
      }
      gen_load_gpr(tcg_ctx,t,rs);
      if (wordsz == 0x40) {
        tcg_gen_mov_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t);
      }
      else if (wordsz == 0x20) {
        tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t);
      }
    }
    else {
      t_00 = tcg_temp_new_i64(tcg_ctx);
      gen_load_gpr(tcg_ctx,t,rt);
      gen_load_gpr(tcg_ctx,t_00,rs);
      if (wordsz == 0x40) {
        tcg_gen_shli_i64_mips64el(tcg_ctx,t,t,(long)bits);
        tcg_gen_shri_i64_mips64el(tcg_ctx,t_00,t_00,(long)(0x40 - bits));
        tcg_gen_or_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],t_00,t);
      }
      else if (wordsz == 0x20) {
        ret = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_concat32_i64(tcg_ctx,ret,t_00,t);
        tcg_gen_shri_i64_mips64el(tcg_ctx,ret,ret,(long)(0x20 - bits));
        tcg_gen_ext32s_i64_mips64el(tcg_ctx,tcg_ctx->cpu_gpr[(uint)rd],ret);
        tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(ret + (long)tcg_ctx));
      }
      tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t_00 + (long)tcg_ctx));
    }
    tcg_temp_free_internal_mips64el(tcg_ctx,(TCGTemp *)(t + (long)tcg_ctx));
    return;
  }
  return;
}

Assistant:

static void gen_align_bits(DisasContext *ctx, int wordsz, int rd, int rs,
                           int rt, int bits)
{
    TCGContext *tcg_ctx = ctx->uc->tcg_ctx;
    TCGv t0;
    if (rd == 0) {
        /* Treat as NOP. */
        return;
    }
    t0 = tcg_temp_new(tcg_ctx);
    if (bits == 0 || bits == wordsz) {
        if (bits == 0) {
            gen_load_gpr(tcg_ctx, t0, rt);
        } else {
            gen_load_gpr(tcg_ctx, t0, rs);
        }
        switch (wordsz) {
        case 32:
            tcg_gen_ext32s_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
            break;
#if defined(TARGET_MIPS64)
        case 64:
            tcg_gen_mov_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t0);
            break;
#endif
        }
    } else {
        TCGv t1 = tcg_temp_new(tcg_ctx);
        gen_load_gpr(tcg_ctx, t0, rt);
        gen_load_gpr(tcg_ctx, t1, rs);
        switch (wordsz) {
        case 32:
            {
                TCGv_i64 t2 = tcg_temp_new_i64(tcg_ctx);
                tcg_gen_concat_tl_i64(tcg_ctx, t2, t1, t0);
                tcg_gen_shri_i64(tcg_ctx, t2, t2, 32 - bits);
                gen_move_low32(tcg_ctx, tcg_ctx->cpu_gpr[rd], t2);
                tcg_temp_free_i64(tcg_ctx, t2);
            }
            break;
#if defined(TARGET_MIPS64)
        case 64:
            tcg_gen_shli_tl(tcg_ctx, t0, t0, bits);
            tcg_gen_shri_tl(tcg_ctx, t1, t1, 64 - bits);
            tcg_gen_or_tl(tcg_ctx, tcg_ctx->cpu_gpr[rd], t1, t0);
            break;
#endif
        }
        tcg_temp_free(tcg_ctx, t1);
    }

    tcg_temp_free(tcg_ctx, t0);
}